

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O3

int bip38_from_private_key
              (uchar *bytes,size_t bytes_len,uchar *pass,size_t pass_len,uint32_t flags,
              char **output)

{
  int iVar1;
  bip38_layout_t buf;
  undefined1 local_44;
  uchar local_43 [43];
  
  if (output == (char **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (char *)0x0;
    iVar1 = bip38_raw_from_private_key(bytes,bytes_len,pass,pass_len,flags,local_43,0x27);
    if (iVar1 == 0) {
      iVar1 = wally_base58_from_bytes(local_43,0x27,1,output);
    }
    wally_clear(&local_44,0x2c);
  }
  return iVar1;
}

Assistant:

int bip38_from_private_key(const unsigned char *bytes, size_t bytes_len,
                           const unsigned char *pass, size_t pass_len,
                           uint32_t flags, char **output)
{
    struct bip38_layout_t buf;
    int ret;

    if (!output)
        return WALLY_EINVAL;

    *output = NULL;

    ret = bip38_raw_from_private_key(bytes, bytes_len, pass, pass_len,
                                     flags, &buf.prefix, BIP38_SERIALIZED_LEN);
    if (!ret)
        ret = wally_base58_from_bytes(&buf.prefix, BIP38_SERIALIZED_LEN,
                                      BASE58_FLAG_CHECKSUM, output);

    wally_clear(&buf, sizeof(buf));
    return ret;
}